

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conncache.c
# Opt level: O2

void Curl_conncache_remove_conn(conncache *connc,connectdata *conn)

{
  connectbundle *bundle;
  curl_llist_element *e;
  size_t sVar1;
  curl_llist *pcVar2;
  
  bundle = conn->bundle;
  if (bundle != (connectbundle *)0x0) {
    pcVar2 = bundle->conn_list;
    while (e = pcVar2->head, e != (curl_llist_element *)0x0) {
      if ((connectdata *)e->ptr == conn) {
        Curl_llist_remove(bundle->conn_list,e,(void *)0x0);
        sVar1 = bundle->num_connections - 1;
        bundle->num_connections = sVar1;
        conn->bundle = (connectbundle *)0x0;
        goto LAB_0044388d;
      }
      pcVar2 = (curl_llist *)&e->next;
    }
    sVar1 = bundle->num_connections;
LAB_0044388d:
    if (sVar1 == 0) {
      conncache_remove_bundle(connc,bundle);
    }
    if (connc != (conncache *)0x0) {
      connc->num_connections = connc->num_connections - 1;
    }
  }
  return;
}

Assistant:

void Curl_conncache_remove_conn(struct conncache *connc,
                                struct connectdata *conn)
{
  struct connectbundle *bundle = conn->bundle;

  /* The bundle pointer can be NULL, since this function can be called
     due to a failed connection attempt, before being added to a bundle */
  if(bundle) {
    bundle_remove_conn(bundle, conn);
    if(bundle->num_connections == 0) {
      conncache_remove_bundle(connc, bundle);
    }

    if(connc) {
      connc->num_connections--;

      DEBUGF(infof(conn->data, "The cache now contains %"
                   CURL_FORMAT_CURL_OFF_TU " members\n",
                   (curl_off_t) connc->num_connections));
    }
  }
}